

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path,bool skip_extensions)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  DescriptorBuilder *pDVar1;
  pointer ppFVar2;
  FieldDescriptor *this_01;
  bool bVar3;
  int iVar4;
  int iVar5;
  CppType CVar6;
  Type TVar7;
  UninterpretedOption_NamePart *pUVar8;
  string *psVar9;
  Descriptor *pDVar10;
  ulong uVar11;
  FileDescriptor *pFVar12;
  Reflection *pRVar13;
  UnknownFieldSet *pUVar14;
  pointer pUVar15;
  reference ppFVar16;
  LogMessage *pLVar17;
  type pUVar18;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int>,_int>_>
  piVar19;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int>,_std::vector<int>_>_>
  this_02;
  bool bVar20;
  string_view sVar21;
  byte local_48a;
  int local_3a0;
  Type local_39c;
  int index;
  Voidify local_382;
  byte local_381;
  LogMessage local_380;
  Voidify local_369;
  undefined1 local_368 [8];
  string outstr;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  undefined1 local_338 [8];
  reverse_iterator iter;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  const_iterator local_320;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_318;
  const_iterator local_310;
  anon_class_8_1_84377f33 local_308;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_300;
  anon_class_8_1_84377f33 local_2f0;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_2e8;
  anon_class_8_1_84377f33 local_2d8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_2d0;
  int local_2bc;
  anon_class_16_2_b122af33 local_2b8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_2a8;
  anon_class_8_1_84377f33 local_298;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_290;
  anon_class_16_2_99f127a2 local_280;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_270;
  undefined4 local_25c;
  string_view local_258;
  AlphaNum local_248;
  string_view local_218;
  string_view local_208;
  SymbolBase *local_1f8;
  AlphaNum local_1f0;
  AlphaNum local_1c0;
  AlphaNum local_190;
  AlphaNum local_160;
  string *local_130;
  string *name_part;
  undefined1 local_120 [4];
  int i;
  vector<int,_std::allocator<int>_> dest_path;
  undefined1 local_100 [8];
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  FieldDescriptor *field;
  Descriptor *descriptor;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_89;
  string_view local_88;
  Symbol local_78;
  Symbol symbol;
  Descriptor *options_descriptor;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_60;
  anon_class_1_0_00000001 local_49;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_48;
  byte local_31;
  vector<int,_std::allocator<int>_> *pvStack_30;
  bool skip_extensions_local;
  vector<int,_std::allocator<int>_> *options_path_local;
  vector<int,_std::allocator<int>_> *src_path_local;
  Message *options_local;
  OptionInterpreter *this_local;
  
  local_31 = skip_extensions;
  pvStack_30 = options_path;
  options_path_local = src_path;
  src_path_local = (vector<int,_std::allocator<int>_> *)options;
  options_local = (Message *)this;
  iVar4 = UninterpretedOption::name_size(this->uninterpreted_option_);
  if (iVar4 == 0) {
    if ((local_31 & 1) == 0) {
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_48,&local_49);
      this_local._7_1_ = AddNameError(this,local_48);
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else {
    pUVar8 = UninterpretedOption::name(this->uninterpreted_option_,0);
    psVar9 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar8);
    bVar3 = std::operator==(psVar9,"uninterpreted_option");
    if (bVar3) {
      if ((local_31 & 1) == 0) {
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__1,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_60,
                   (anon_class_1_0_00000001 *)((long)&options_descriptor + 7));
        this_local._7_1_ = AddNameError(this,local_60);
      }
      else {
        this_local._7_1_ = 1;
      }
    }
    else {
      bVar20 = (bool)(local_31 & 1);
      pUVar8 = UninterpretedOption::name(this->uninterpreted_option_,0);
      bVar3 = UninterpretedOption_NamePart::is_extension(pUVar8);
      if (bVar20 == bVar3) {
        this_local._7_1_ = 1;
      }
      else {
        symbol.ptr_ = (SymbolBase *)0x0;
        pDVar1 = this->builder_;
        pDVar10 = Message::GetDescriptor((Message *)src_path_local);
        local_88 = Descriptor::full_name(pDVar10);
        local_78 = FindSymbolNotEnforcingDeps(pDVar1,local_88,true);
        symbol.ptr_ = &Symbol::descriptor(&local_78)->super_SymbolBase;
        if ((Descriptor *)symbol.ptr_ == (Descriptor *)0x0) {
          symbol.ptr_ = &Message::GetDescriptor((Message *)src_path_local)->super_SymbolBase;
        }
        local_a1 = 0;
        if (symbol.ptr_ == (SymbolBase *)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x2519,"options_descriptor");
          local_a1 = 1;
          pLVar17 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar17);
        }
        if ((local_a1 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_a0);
        }
        field = (FieldDescriptor *)symbol.ptr_;
        intermediate_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)((long)&debug_msg_name.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,"",
                   (allocator<char> *)
                   ((long)&dest_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&dest_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_120,pvStack_30);
        name_part._4_4_ = 0;
        while( true ) {
          iVar4 = name_part._4_4_;
          iVar5 = UninterpretedOption::name_size(this->uninterpreted_option_);
          if (iVar5 <= iVar4) break;
          std::__cxx11::string::clear();
          pUVar8 = UninterpretedOption::name(this->uninterpreted_option_,name_part._4_4_);
          local_130 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar8);
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            absl::lts_20250127::AlphaNum::AlphaNum(&local_160,".");
            absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_100,&local_160);
          }
          pUVar8 = UninterpretedOption::name(this->uninterpreted_option_,name_part._4_4_);
          bVar3 = UninterpretedOption_NamePart::is_extension(pUVar8);
          if (bVar3) {
            absl::lts_20250127::AlphaNum::AlphaNum(&local_190,"(");
            absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_1c0,local_130);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_1f0,")");
            absl::lts_20250127::StrAppend
                      ((Nonnull<std::string_*>)local_100,&local_190,&local_1c0,&local_1f0);
            pDVar1 = this->builder_;
            sVar21 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
            local_208 = sVar21;
            sVar21 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)this->options_to_interpret_);
            local_218 = sVar21;
            local_1f8 = (SymbolBase *)
                        LookupSymbol(pDVar1,local_208,sVar21,PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
            local_78 = (Symbol)local_1f8;
            intermediate_fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)Symbol::field_descriptor(&local_78);
          }
          else {
            absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_248,local_130);
            absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_100,&local_248);
            this_01 = field;
            sVar21 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
            local_258 = sVar21;
            intermediate_fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)Descriptor::FindFieldByName((Descriptor *)this_01,sVar21);
          }
          if (intermediate_fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            bVar3 = get_allow_unknown(this->builder_->pool_);
            if (bVar3) {
              AddWithoutInterpreting(this,this->uninterpreted_option_,(Message *)src_path_local);
              this_local._7_1_ = 1;
              local_25c = 1;
            }
            else {
              uVar11 = std::__cxx11::string::empty();
              if ((uVar11 & 1) == 0) {
                local_280.debug_msg_name = (string *)local_100;
                local_280.this = this;
                absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
                FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__2,void>
                          ((FunctionRef<std::__cxx11::string()> *)&local_270,&local_280);
                this_local._7_1_ = AddNameError(this,local_270);
                local_25c = 1;
              }
              else {
                local_298.debug_msg_name = (string *)local_100;
                absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
                FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__3,void>
                          ((FunctionRef<std::__cxx11::string()> *)&local_290,&local_298);
                this_local._7_1_ = AddNameError(this,local_290);
                local_25c = 1;
              }
            }
            goto LAB_005e8123;
          }
          pDVar10 = FieldDescriptor::containing_type
                              ((FieldDescriptor *)
                               intermediate_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (pDVar10 != (Descriptor *)field) {
            pDVar10 = FieldDescriptor::containing_type
                                ((FieldDescriptor *)
                                 intermediate_fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar3 = get_is_placeholder(pDVar10);
            if (bVar3) {
              AddWithoutInterpreting(this,this->uninterpreted_option_,(Message *)src_path_local);
              this_local._7_1_ = 1;
              local_25c = 1;
            }
            else {
              local_2b8.debug_msg_name = (string *)local_100;
              local_2b8.descriptor = (Descriptor **)&field;
              absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
              FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__4,void>
                        ((FunctionRef<std::__cxx11::string()> *)&local_2a8,&local_2b8);
              this_local._7_1_ = AddNameError(this,local_2a8);
              local_25c = 1;
            }
            goto LAB_005e8123;
          }
          local_2bc = FieldDescriptor::number
                                ((FieldDescriptor *)
                                 intermediate_fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_120,&local_2bc);
          pFVar12 = FieldDescriptor::file
                              ((FieldDescriptor *)
                               intermediate_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (pFVar12 == this->builder_->file_) {
            pUVar8 = UninterpretedOption::name(this->uninterpreted_option_,0);
            psVar9 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar8);
            bVar3 = std::operator==(psVar9,"features");
            if (bVar3) {
              pUVar8 = UninterpretedOption::name(this->uninterpreted_option_,0);
              bVar3 = UninterpretedOption_NamePart::is_extension(pUVar8);
              if (!bVar3) {
                local_2d8.debug_msg_name = (string *)local_100;
                absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
                FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__5,void>
                          ((FunctionRef<std::__cxx11::string()> *)&local_2d0,&local_2d8);
                this_local._7_1_ = AddNameError(this,local_2d0);
                local_25c = 1;
                goto LAB_005e8123;
              }
            }
          }
          iVar4 = name_part._4_4_;
          iVar5 = UninterpretedOption::name_size(this->uninterpreted_option_);
          if (iVar4 < iVar5 + -1) {
            CVar6 = FieldDescriptor::cpp_type
                              ((FieldDescriptor *)
                               intermediate_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (CVar6 != CPPTYPE_MESSAGE) {
              local_2f0.debug_msg_name = (string *)local_100;
              absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
              FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__6,void>
                        ((FunctionRef<std::__cxx11::string()> *)&local_2e8,&local_2f0);
              this_local._7_1_ = AddNameError(this,local_2e8);
              local_25c = 1;
              goto LAB_005e8123;
            }
            bVar3 = FieldDescriptor::is_repeated
                              ((FieldDescriptor *)
                               intermediate_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar3) {
              local_308.debug_msg_name = (string *)local_100;
              absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
              FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__7,void>
                        ((FunctionRef<std::__cxx11::string()> *)&local_300,&local_308);
              this_local._7_1_ = AddNameError(this,local_300);
              local_25c = 1;
              goto LAB_005e8123;
            }
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)((long)&debug_msg_name.field_2 + 8),
                        (value_type *)
                        &intermediate_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            field = (FieldDescriptor *)
                    FieldDescriptor::message_type
                              ((FieldDescriptor *)
                               intermediate_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          name_part._4_4_ = name_part._4_4_ + 1;
        }
        bVar3 = FieldDescriptor::is_repeated
                          ((FieldDescriptor *)
                           intermediate_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_48a = 0;
        if (!bVar3) {
          this_00 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)((long)&debug_msg_name.field_2 + 8);
          local_318._M_current =
               (FieldDescriptor **)
               std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::begin(this_00);
          __gnu_cxx::
          __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
          ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                    ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                      *)&local_310,&local_318);
          unknown_fields._M_t.
          super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
               (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
                )std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::end(this_00);
          __gnu_cxx::
          __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
          ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                    ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                      *)&local_320,
                     (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                      *)&unknown_fields);
          ppFVar2 = intermediate_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pRVar13 = Message::GetReflection((Message *)src_path_local);
          pUVar14 = Reflection::GetUnknownFields(pRVar13,(Message *)src_path_local);
          bVar3 = ExamineIfOptionIsSet
                            (this,local_310,local_320,(FieldDescriptor *)ppFVar2,(string *)local_100
                             ,pUVar14);
          local_48a = bVar3 ^ 0xff;
        }
        if ((local_48a & 1) == 0) {
          pUVar14 = (UnknownFieldSet *)operator_new(0x10);
          UnknownFieldSet::UnknownFieldSet(pUVar14);
          std::
          unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
          ::unique_ptr<std::default_delete<google::protobuf::UnknownFieldSet>,void>
                    ((unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
                      *)&iter,pUVar14);
          ppFVar2 = intermediate_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pUVar15 = std::
                    unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                    ::get((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                           *)&iter);
          bVar3 = SetOptionValue(this,(FieldDescriptor *)ppFVar2,pUVar15);
          if (bVar3) {
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::rbegin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_338);
            while( true ) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::rend((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)&parent_unknown_fields);
              bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                       *)local_338,
                                      (reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                       *)&parent_unknown_fields);
              if (!bVar3) break;
              pUVar14 = (UnknownFieldSet *)operator_new(0x10);
              UnknownFieldSet::UnknownFieldSet(pUVar14);
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
              ::unique_ptr<std::default_delete<google::protobuf::UnknownFieldSet>,void>
                        ((unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
                          *)(outstr.field_2._M_local_buf + 8),pUVar14);
              ppFVar16 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                      *)local_338);
              TVar7 = FieldDescriptor::type(*ppFVar16);
              if (TVar7 == TYPE_GROUP) {
                pUVar15 = std::
                          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ::operator->((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                        *)((long)&outstr.field_2 + 8));
                ppFVar16 = std::
                           reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                        *)local_338);
                iVar4 = FieldDescriptor::number(*ppFVar16);
                pUVar14 = UnknownFieldSet::AddGroup(pUVar15,iVar4);
                pUVar18 = std::
                          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                       *)&iter);
                UnknownFieldSet::MergeFrom(pUVar14,pUVar18);
              }
              else {
                if (TVar7 != TYPE_MESSAGE) {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&index,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                             ,0x25c5);
                  pLVar17 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                      ((LogMessage *)&index);
                  pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                      (pLVar17,(char (*) [40])
                                               "Invalid wire type for CPPTYPE_MESSAGE: ");
                  ppFVar16 = std::
                             reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                          *)local_338);
                  local_39c = FieldDescriptor::type(*ppFVar16);
                  pLVar17 = absl::lts_20250127::log_internal::LogMessage::
                            operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                                      (pLVar17,&local_39c);
                  absl::lts_20250127::log_internal::Voidify::operator&&(&local_382,pLVar17);
                  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                            ((LogMessageFatal *)&index);
                }
                std::__cxx11::string::string((string *)local_368);
                pUVar15 = std::
                          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ::operator->((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                        *)&iter);
                local_381 = 0;
                bVar3 = UnknownFieldSet::SerializeToString(pUVar15,(string *)local_368);
                if (((bVar3 ^ 0xffU) & 1) != 0) {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_380,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                             ,0x25b6,"unknown_fields->SerializeToString(&outstr)");
                  local_381 = 1;
                  pLVar17 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_380)
                  ;
                  pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                      (pLVar17,(char (*) [56])
                                               "Unexpected failure while serializing option submessage "
                                      );
                  pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                      (pLVar17,(string *)local_100);
                  pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                      (pLVar17,(char (*) [3])0xb7cf00);
                  absl::lts_20250127::log_internal::Voidify::operator&&(&local_369,pLVar17);
                }
                if ((local_381 & 1) != 0) {
                  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                            ((LogMessageFatal *)&local_380);
                }
                pUVar15 = std::
                          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ::operator->((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                        *)((long)&outstr.field_2 + 8));
                ppFVar16 = std::
                           reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                        *)local_338);
                iVar4 = FieldDescriptor::number(*ppFVar16);
                UnknownFieldSet::AddLengthDelimited<>(pUVar15,iVar4,(string *)local_368);
                local_25c = 8;
                std::__cxx11::string::~string((string *)local_368);
              }
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ::operator=((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                           *)&iter,(unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                    *)((long)&outstr.field_2 + 8));
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ::~unique_ptr((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                             *)((long)&outstr.field_2 + 8));
              std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                            *)local_338);
            }
            pRVar13 = Message::GetReflection((Message *)src_path_local);
            pUVar14 = Reflection::MutableUnknownFields(pRVar13,(Message *)src_path_local);
            pUVar18 = std::
                      unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                      ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                   *)&iter);
            UnknownFieldSet::MergeFrom(pUVar14,pUVar18);
            bVar3 = FieldDescriptor::is_repeated
                              ((FieldDescriptor *)
                               intermediate_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar3) {
              piVar19 = absl::lts_20250127::container_internal::
                        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
                        ::
                        operator[]<std::vector<int,std::allocator<int>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>>
                                  ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
                                    *)&this->repeated_option_counts_,
                                   (key_arg<std::vector<int>_> *)local_120);
              local_3a0 = *piVar19;
              *piVar19 = local_3a0 + 1;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_120,&local_3a0);
            }
            this_02 = absl::lts_20250127::container_internal::
                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                      ::
                      operator[]<std::vector<int,std::allocator<int>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>>
                                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                                  *)&this->interpreted_paths_,options_path_local);
            std::vector<int,_std::allocator<int>_>::operator=
                      (this_02,(vector<int,_std::allocator<int>_> *)local_120);
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
          local_25c = 1;
          std::
          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          ::~unique_ptr((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                         *)&iter);
        }
        else {
          this_local._7_1_ = 0;
          local_25c = 1;
        }
LAB_005e8123:
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_120);
        std::__cxx11::string::~string((string *)local_100);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)((long)&debug_msg_name.field_2 + 8));
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path, bool skip_extensions) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError(
        []() -> std::string { return "Option must have a name."; });
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError([]() -> std::string {
      return "Option must not use reserved name \"uninterpreted_option\".";
    });
  }

  if (skip_extensions == uninterpreted_option_->name(0).is_extension()) {
    // Allow feature and option interpretation to occur in two phases.  This is
    // necessary because features *are* options and need to be interpreted
    // before resolving them.  However, options can also *have* features
    // attached to them.
    return true;
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  ABSL_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (!debug_msg_name.empty()) {
      absl::StrAppend(&debug_msg_name, ".");
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      absl::StrAppend(&debug_msg_name, "(", name_part, ")");
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      absl::StrAppend(&debug_msg_name, name_part);
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" is resolved to \"(",
              builder_->undefine_resolved_name_,
              ")\", which is not defined. The innermost scope is searched "
              "first "
              "in name resolution. Consider using a leading '.'(i.e., \"(.",
              debug_msg_name.substr(1),
              "\") to start from the outermost scope.");
        });
      } else {
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" unknown. Ensure that your proto",
              " definition file imports the proto which defines the option.");
        });
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError([&] {
          return absl::StrCat("Option field \"", debug_msg_name,
                              "\" is not a field or extension of message \"",
                              descriptor->name(), "\".");
        });
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      // Special handling to prevent feature use in the same file as the
      // definition.
      // TODO Add proper support for cases where this can work.
      if (field->file() == builder_->file_ &&
          uninterpreted_option_->name(0).name_part() == "features" &&
          !uninterpreted_option_->name(0).is_extension()) {
        return AddNameError([&] {
          return absl::StrCat(
              "Feature \"", debug_msg_name,
              "\" can't be used in the same file it's defined in.");
        });
      }

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError([&] {
            return absl::StrCat("Option \"", debug_msg_name,
                                "\" is an atomic type, not a message.");
          });
        } else if (field->is_repeated()) {
          return AddNameError([&] {
            return absl::StrCat("Option field \"", debug_msg_name,
                                "\" is a repeated message. Repeated message "
                                "options must be initialized using an "
                                "aggregate value.");
          });
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        std::string outstr;
        ABSL_CHECK(unknown_fields->SerializeToString(&outstr))
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        parent_unknown_fields->AddLengthDelimited((*iter)->number(),
                                                  std::move(outstr));
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                        << (*iter)->type();
        return false;
    }
    unknown_fields = std::move(parent_unknown_fields);
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}